

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_font * rf_load_image_font(rf_font *__return_storage_ptr__,rf_image image,rf_color key,
                            rf_allocator allocator)

{
  rf_source_location rVar1;
  rf_allocator_args rVar2;
  rf_mipmaps_image image_00;
  rf_glyph_info *dst;
  rf_font result;
  int codepoints [95];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  uint in_stack_fffffffffffffde4;
  char *pcVar6;
  rf_allocator local_200;
  int local_1f0;
  undefined8 local_1ec;
  int local_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined7 uStack_1bf;
  int local_1b8 [98];
  
  local_200.user_data = allocator.user_data;
  __return_storage_ptr__->glyphs = (rf_glyph_info *)0x0;
  __return_storage_ptr__->glyphs_count = 0;
  (__return_storage_ptr__->texture).mipmaps = 0;
  (__return_storage_ptr__->texture).format = 0;
  *(undefined8 *)&(__return_storage_ptr__->texture).valid = 0;
  __return_storage_ptr__->base_size = 0;
  (__return_storage_ptr__->texture).id = 0;
  (__return_storage_ptr__->texture).width = 0;
  (__return_storage_ptr__->texture).height = 0;
  *(undefined8 *)&__return_storage_ptr__->valid = 0;
  if (image.valid == true) {
    local_200.allocator_proc = allocator.allocator_proc;
    memcpy(local_1b8,&DAT_0017ac30,0x17c);
    pcVar6 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    uVar3 = 0;
    uVar4 = 0xc00;
    uVar5 = 0;
    rVar1.proc_name = "rf_load_image_font";
    rVar1.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar1.line_in_file = 0x5cc8;
    rVar2._16_8_ = (ulong)in_stack_fffffffffffffde4 << 0x20;
    rVar2.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0xc00) << 0x40,0);
    rVar2.size_to_allocate_or_reallocate = SUB168(ZEXT816(0xc00) << 0x40,8);
    dst = (rf_glyph_info *)(*allocator.allocator_proc)(&local_200,rVar1,RF_AM_ALLOC,rVar2);
    rf_compute_glyph_metrics_from_image(image,key,local_1b8,dst,0x60);
    local_1f0 = 0;
    image_00.field_0._8_8_ = uVar4;
    image_00.field_0.image.data = (void *)uVar3;
    image_00.field_0.image.format = uVar5;
    image_00.field_0._20_4_ = in_stack_fffffffffffffde4;
    image_00._24_8_ = pcVar6;
    rf_load_texture_from_image_with_mipmaps(image_00);
    if (dst != (rf_glyph_info *)0x0) {
      local_1f0 = (int)(dst->field_0).rec.height;
    }
    *(ulong *)&__return_storage_ptr__->valid = CONCAT71(uStack_1bf,dst != (rf_glyph_info *)0x0);
    __return_storage_ptr__->glyphs = dst;
    __return_storage_ptr__->glyphs_count = 0x60;
    (__return_storage_ptr__->texture).mipmaps = (undefined4)local_1e0;
    (__return_storage_ptr__->texture).format = local_1e0._4_4_;
    *(undefined8 *)&(__return_storage_ptr__->texture).valid = uStack_1d8;
    __return_storage_ptr__->base_size = local_1f0;
    (__return_storage_ptr__->texture).id = (undefined4)local_1ec;
    (__return_storage_ptr__->texture).width = local_1ec._4_4_;
    (__return_storage_ptr__->texture).height = local_1e4;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_font rf_load_image_font(rf_image image, rf_color key, rf_allocator allocator)
{
    rf_font result = {0};

    if (image.valid)
    {
        const int codepoints[]     = RF_BUILTIN_FONT_CHARS;
        const int codepoints_count = RF_BUILTIN_CODEPOINTS_COUNT;

        rf_glyph_info* glyphs = RF_ALLOC(allocator, codepoints_count * sizeof(rf_glyph_info));

        rf_compute_glyph_metrics_from_image(image, key, codepoints, glyphs, codepoints_count);

        result = rf_load_image_font_from_data(image, glyphs, codepoints_count);
    }

    return result;
}